

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O3

shared_ptr<aeron::archive::AeronArchive> aeron::archive::AeronArchive::asyncConnect(Context *ctx)

{
  char *pcVar1;
  SourcedException *this;
  char *pcVar2;
  char *pcVar3;
  allocator local_89;
  string local_88;
  string local_68;
  string local_48;
  
  this = (SourcedException *)__cxa_allocate_exception(0x48);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"not implemented","");
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,
             "static std::shared_ptr<AeronArchive> aeron::archive::AeronArchive::asyncConnect(const Context &)"
             ,"");
  pcVar3 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp"
  ;
  pcVar2 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client";
  do {
    pcVar2 = pcVar2 + 1;
    pcVar1 = pcVar3 + 1;
    pcVar3 = pcVar3 + 1;
  } while (*pcVar2 == *pcVar1);
  std::__cxx11::string::string((string *)&local_48,pcVar3 + (*pcVar1 == '/'),&local_89);
  aeron::util::SourcedException::SourcedException(this,&local_88,&local_68,&local_48,0x55);
  *(undefined ***)this = &PTR__SourcedException_00163260;
  __cxa_throw(this,&ArchiveException::typeinfo,aeron::util::SourcedException::~SourcedException);
}

Assistant:

std::shared_ptr<AeronArchive> AeronArchive::asyncConnect(const Context& ctx) {
    throw ArchiveException("not implemented", SOURCEINFO);
}